

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_erl_generator.cc
# Opt level: O0

string * __thiscall
t_erl_generator::atomify(string *__return_storage_ptr__,t_erl_generator *this,string *in)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *in_local;
  t_erl_generator *this_local;
  
  local_20 = in;
  in_local = (string *)this;
  this_local = (t_erl_generator *)__return_storage_ptr__;
  if ((this->legacy_names_ & 1U) == 0) {
    std::operator+(&local_b0,"\'",in);
    std::operator+(__return_storage_ptr__,&local_b0,"\'");
    std::__cxx11::string::~string((string *)&local_b0);
  }
  else {
    std::__cxx11::string::string((string *)&local_80,(string *)in);
    t_generator::decapitalize(&local_60,&this->super_t_generator,&local_80);
    std::operator+(&local_40,"\'",&local_60);
    std::operator+(__return_storage_ptr__,&local_40,"\'");
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string atomify(std::string in) {
    if (legacy_names_) {
      return "'" + decapitalize(in) + "'";
    } else {
      return "'" + in + "'";
    }
  }